

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O1

exr_result_t
exr_attr_list_find_by_name
          (exr_const_context_t ctxt,exr_attribute_list_t *list,char *name,exr_attribute_t **out)

{
  uint uVar1;
  exr_attribute_t **ppeVar2;
  exr_attribute_t *peVar3;
  int iVar4;
  exr_result_t eVar5;
  code *UNRECOVERED_JUMPTABLE;
  char *pcVar6;
  exr_attribute_t **ppeVar7;
  int iVar8;
  ulong uVar9;
  
  if (ctxt == (exr_const_context_t)0x0) {
    return 2;
  }
  if (out == (exr_attribute_t **)0x0) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
    pcVar6 = "Invalid output pointer passed to find_by_name";
  }
  else if ((name == (char *)0x0) || (*name == '\0')) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
    pcVar6 = "Invalid name passed to find_by_name";
  }
  else {
    if (list != (exr_attribute_list_t *)0x0) {
      ppeVar2 = list->sorted_entries;
      if (ppeVar2 == (exr_attribute_t **)0x0) {
        return 0xf;
      }
      uVar1 = list->num_attributes;
      ppeVar7 = ppeVar2;
      if (0 < (long)(int)uVar1) {
        uVar9 = (ulong)uVar1;
        do {
          iVar8 = (int)uVar9;
          uVar9 = uVar9 >> 1;
          peVar3 = ppeVar7[uVar9];
          iVar4 = strcmp(peVar3->name,name);
          if (iVar4 == 0) {
            *out = peVar3;
            return 0;
          }
          if (iVar4 < 0) {
            ppeVar7 = ppeVar7 + uVar9 + 1;
            uVar9 = (ulong)(iVar8 + ~(uint)uVar9);
          }
        } while (0 < (int)uVar9);
      }
      if (ppeVar7 < ppeVar2 + (int)uVar1 && ppeVar7 != (exr_attribute_t **)0x0) {
        peVar3 = *ppeVar7;
        iVar4 = strcmp(peVar3->name,name);
        if (iVar4 == 0) {
          *out = peVar3;
          return 0;
        }
        return 0xf;
      }
      return 0xf;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
    pcVar6 = "Invalid list pointer passed to find_by_name";
  }
  eVar5 = (*UNRECOVERED_JUMPTABLE)(ctxt,3,pcVar6);
  return eVar5;
}

Assistant:

exr_result_t
exr_attr_list_find_by_name (
    exr_const_context_t   ctxt,
    exr_attribute_list_t* list,
    const char*           name,
    exr_attribute_t**     out)
{
    exr_attribute_t** it    = NULL;
    exr_attribute_t** first = NULL;
    exr_attribute_t** end   = NULL;
    int               step, count, cmp;
    INTERN_EXR_PROMOTE_CONST_CONTEXT_OR_ERROR (ctxt);

    if (!out)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid output pointer passed to find_by_name");

    if (!name || name[0] == '\0')
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid name passed to find_by_name");

    if (!list)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid list pointer passed to find_by_name");

    if (list->sorted_entries)
    {
        first = list->sorted_entries;
        count = list->num_attributes;
        end   = first + count;
        /* lower bound search w/ equality check */
        while (count > 0)
        {
            it   = first;
            step = count / 2;
            it += step;
            cmp = strcmp ((*it)->name, name);
            if (cmp == 0)
            {
                // early exit
                *out = (*it);
                return EXR_ERR_SUCCESS;
            }

            if (cmp < 0)
            {
                first = ++it;
                count -= step + 1;
            }
            else
                count = step;
        }

        if (first && first < end && 0 == strcmp ((*first)->name, name))
        {
            *out = (*first);
            return EXR_ERR_SUCCESS;
        }
    }

    return EXR_ERR_NO_ATTR_BY_NAME;
}